

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::JsRTByteBufferAction_Parse<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  uint32 uVar2;
  JsRTByteBufferAction *pJVar3;
  TTDVar pvVar4;
  byte *pbVar5;
  uint32 i;
  ulong uVar6;
  
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTByteBufferAction,(TTD::NSLogEvents::EventKind)39>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar3->Result = pvVar4;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  uVar2 = FileReader::ReadLengthValue(reader,true);
  pJVar3->Length = uVar2;
  pJVar3->Buffer = (byte *)0x0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((char)iVar1 != '\0') {
    return;
  }
  if ((ulong)pJVar3->Length == 0) {
    pbVar5 = (byte *)0x0;
  }
  else {
    pbVar5 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)pJVar3->Length);
  }
  pJVar3->Buffer = pbVar5;
  for (uVar6 = 0; uVar6 < pJVar3->Length; uVar6 = uVar6 + 1) {
    iVar1 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar6 != 0));
    pJVar3->Buffer[uVar6] = (byte)iVar1;
  }
  (*reader->_vptr_FileReader[5])(reader);
  return;
}

Assistant:

void JsRTByteBufferAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            bool badValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            bufferAction->Length = reader->ReadLengthValue(true);
            bufferAction->Buffer = nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            if(!badValue)
            {
                bufferAction->Buffer = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    bufferAction->Buffer[i] = reader->ReadNakedByte(i != 0);
                }
                reader->ReadSequenceEnd();
            }
        }